

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeader(char *label)

{
  ImSpan<ImGuiTableColumn> *this;
  ImVec2 *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ImGuiWindow *this_00;
  ImGuiTable *table;
  ImVec2 IVar5;
  ImDrawList *draw_list;
  ImVec2 IVar6;
  _Bool _Var7;
  bool bVar8;
  ImGuiID id;
  ImU32 IVar9;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *column;
  char *text_end;
  ImGuiTableColumn *pIVar10;
  ImGuiContext_conflict1 *pIVar11;
  char *text;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  float fVar19;
  ImRect IVar20;
  bool held;
  bool hovered;
  ImGuiContext_conflict1 *local_108;
  int local_100;
  char sort_order_suf [4];
  float local_d8;
  float fStack_d4;
  float local_c8;
  float fStack_c4;
  float local_98;
  float fStack_94;
  ImVec2 label_pos;
  ImVec2 label_size;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  this_00 = (ImGuiWindow *)GImGui->CurrentWindow;
  if (this_00->SkipItems != false) {
    return;
  }
  local_108 = GImGui;
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableHeader() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xb30,"void ImGui::TableHeader(const char *)");
  }
  iVar4 = table->CurrentColumn;
  if (iVar4 == -1) {
    __assert_fail("table->CurrentColumn != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xb31,"void ImGui::TableHeader(const char *)");
  }
  this = &table->Columns;
  column = ImSpan<ImGuiTableColumn>::operator[](this,iVar4);
  text = "";
  if (label != (char *)0x0) {
    text = label;
  }
  text_end = FindRenderedTextEnd(text,(char *)0x0);
  IVar6 = CalcTextSize(text,text_end,true,-1.0);
  IVar5 = (this_00->DC).CursorPos;
  label_pos = IVar5;
  label_size = IVar6;
  IVar20 = TableGetCellBgRect(table,iVar4);
  pIVar11 = local_108;
  local_98 = IVar6.x;
  fStack_94 = IVar6.y;
  local_c8 = IVar20.Max.x;
  fStack_c4 = IVar20.Max.y;
  fVar16 = table->RowMinHeight - (table->CellPaddingY + table->CellPaddingY);
  uVar13 = -(uint)(fVar16 <= fStack_94);
  local_58 = ZEXT416(~uVar13 & (uint)fVar16 | (uint)fStack_94 & uVar13);
  sort_order_suf[0] = '\0';
  sort_order_suf[1] = '\0';
  sort_order_suf[2] = '\0';
  sort_order_suf[3] = '\0';
  fVar16 = 0.0;
  if (((table->Flags & 8) == 0) || ((column->Flags & 0x200) != 0)) {
    fVar17 = 0.0;
  }
  else {
    fVar17 = (float)(int)(local_108->FontSize * 0.65 + (local_108->Style).FramePadding.x);
    if ('\0' < column->SortOrder) {
      ImFormatString(sort_order_suf,4,"%d");
      fVar16 = (pIVar11->Style).ItemInnerSpacing.x;
      IVar6 = CalcTextSize(sort_order_suf,(char *)0x0,false,-1.0);
      fVar16 = IVar6.x + fVar16;
    }
  }
  pIVar11 = local_108;
  fVar19 = local_98 + IVar5.x + fVar16 + fVar17;
  uVar2 = column->ContentMaxXHeadersUsed;
  uVar3 = column->ContentMaxXHeadersIdeal;
  uVar13 = -(uint)(column->WorkMaxX <= (float)uVar2);
  uVar14 = -(uint)(fVar19 <= (float)uVar3);
  uVar18 = CONCAT44(~uVar14 & (uint)fVar19,~uVar13 & (uint)column->WorkMaxX) |
           CONCAT44(uVar3 & uVar14,uVar2 & uVar13);
  column->ContentMaxXHeadersUsed = (float)(int)uVar18;
  column->ContentMaxXHeadersIdeal = (float)(int)(uVar18 >> 0x20);
  if (table->IsContextPopupOpen == true) {
    if (iVar4 == table->ContextPopupColumn) {
      bVar12 = table->InstanceInteracted == table->InstanceCurrent;
    }
    else {
      bVar12 = false;
    }
  }
  else {
    bVar12 = false;
  }
  local_100 = iVar4;
  id = ImGuiWindow::GetID(this_00,text,(char *)0x0);
  local_d8 = IVar20.Min.x;
  fStack_d4 = IVar20.Min.y;
  fVar19 = (pIVar11->Style).CellPadding.y;
  fVar19 = fVar19 + fVar19 + fStack_d4 + (float)local_58._0_4_;
  uVar13 = -(uint)(fVar19 <= fStack_c4);
  local_40.Max.y = (float)(uVar13 & (uint)fStack_c4 | ~uVar13 & (uint)fVar19);
  local_40.Min.x = local_d8;
  local_40.Min.y = fStack_d4;
  local_40.Max.x = local_c8;
  local_60.x = 0.0;
  local_60.y = (float)local_58._0_4_;
  ItemSize(&local_60,-1.0);
  _Var7 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
  if (!_Var7) {
    return;
  }
  bVar8 = ButtonBehavior(&local_40,id,&hovered,&held,0x1000);
  if (pIVar11->ActiveId != id) {
    SetItemAllowOverlap();
  }
  iVar4 = local_100;
  if (((held | hovered) & 1U) == 0 && !bVar12) {
    if ((table->field_0x98 & 1) != 0) goto LAB_001fbe08;
    uVar13 = 0x2c;
  }
  else {
    uVar13 = 0x1a;
    if (held == false) {
      uVar13 = hovered & 1 | 0x18;
    }
  }
  IVar9 = GetColorU32(uVar13,1.0);
  TableSetBgColor(3,IVar9,table->CurrentColumn);
LAB_001fbe08:
  RenderNavHighlight(&local_40,id,10);
  if (held == true) {
    table->HeldHeaderColumn = (ImGuiTableColumnIdx)iVar4;
    (this_00->DC).CursorPos.y = (pIVar11->Style).ItemSpacing.y * -0.5 + (this_00->DC).CursorPos.y;
    if ((((table->Flags & 2) != 0) && (_Var7 = IsMouseDragging(0,-1.0), _Var7)) &&
       (pIVar11->DragDropActive == false)) {
      table->ReorderColumn = (ImGuiTableColumnIdx)iVar4;
      table->InstanceInteracted = table->InstanceCurrent;
      fVar19 = (pIVar11->IO).MouseDelta.x;
      if (fVar19 < 0.0) {
        pIVar1 = &(pIVar11->IO).MousePos;
        if (((pIVar1->x <= local_d8 && local_d8 != pIVar1->x) && (column->PrevEnabledColumn != -1))
           && ((pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,(int)column->PrevEnabledColumn),
               ((pIVar10->Flags | column->Flags) & 0x40U) == 0 &&
               (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
                table->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)))) {
          table->ReorderColumnDir = -1;
        }
        fVar19 = (pIVar11->IO).MouseDelta.x;
      }
      if (((0.0 < fVar19) && (local_c8 < (pIVar11->IO).MousePos.x)) &&
         ((column->NextEnabledColumn != -1 &&
          ((pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,(int)column->NextEnabledColumn),
           ((pIVar10->Flags | column->Flags) & 0x40U) == 0 &&
           (column->IndexWithinEnabledSet < table->FreezeColumnsRequest !=
            table->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)))))) {
        table->ReorderColumnDir = '\x01';
      }
    }
  }
  else {
    (this_00->DC).CursorPos.y = (pIVar11->Style).ItemSpacing.y * -0.5 + (this_00->DC).CursorPos.y;
  }
  fVar19 = IVar5.y;
  fVar17 = (local_c8 - fVar17) - fVar16;
  if (((table->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
    if (column->SortOrder != -1) {
      fVar15 = (float)(~-(uint)(fVar17 <= local_d8) & (uint)fVar17 |
                      (uint)local_d8 & -(uint)(fVar17 <= local_d8));
      if ('\0' < column->SortOrder) {
        IVar9 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar9);
        IVar5.y = fVar19;
        IVar5.x = (pIVar11->Style).ItemInnerSpacing.x + fVar15;
        RenderText(IVar5,sort_order_suf,(char *)0x0,true);
        PopStyleColor(1);
        fVar15 = fVar15 + fVar16;
      }
      draw_list = this_00->DrawList;
      IVar9 = GetColorU32(0,1.0);
      IVar6.y = fVar19;
      IVar6.x = fVar15;
      RenderArrow(draw_list,IVar6,IVar9,(column->field_0x65 & 3) == 1 ^ 3,0.65);
      pIVar11 = local_108;
    }
    if ((bVar8) && (iVar4 != table->ReorderColumn)) {
      sort_direction = TableGetColumnNextSortDirection(column);
      TableSetColumnSortDirection(iVar4,sort_direction,(pIVar11->IO).KeyShift);
    }
  }
  local_60.y = (float)local_58._0_4_ + fVar19 + (pIVar11->Style).FramePadding.y;
  local_60.x = fVar17;
  RenderTextEllipsis(this_00->DrawList,&label_pos,&local_60,fVar17,fVar17,text,text_end,&label_size)
  ;
  if (((fVar17 - label_pos.x < label_size.x) && (hovered == true)) &&
     (local_108->TooltipSlowDelay <= local_108->HoveredIdNotActiveTimer &&
      local_108->HoveredIdNotActiveTimer != local_108->TooltipSlowDelay)) {
    SetTooltip("%.*s",(ulong)(uint)((int)text_end - (int)text));
  }
  _Var7 = IsMouseReleased(1);
  if ((_Var7) && (_Var7 = IsItemHovered(0), _Var7)) {
    TableOpenContextMenu(iVar4);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay)
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}